

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

string * __thiscall
Kraken::KClient::signature
          (string *__return_storage_ptr__,KClient *this,string *path,string *nonce,string *postdata)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  long lVar1;
  long lVar2;
  int iVar3;
  BIO_METHOD *pBVar4;
  BIO *pBVar5;
  BIO *pBVar6;
  HMAC_CTX *ctx;
  EVP_MD *md;
  runtime_error *this_00;
  allocator_type local_f1;
  uint len;
  undefined4 uStack_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_postdata;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  SHA256_CTX local_98;
  
  __first._M_current = (path->_M_dataplus)._M_p;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(__first._M_current + path->_M_string_length),(allocator_type *)&local_98);
  std::operator+(&local_e8,nonce,postdata);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&nonce_postdata,0x20,(allocator_type *)&local_98);
  SHA256_Init(&local_98);
  SHA256_Update(&local_98,local_e8._M_dataplus._M_p,
                CONCAT44(local_e8._M_string_length._4_4_,(int)local_e8._M_string_length));
  SHA256_Final(nonce_postdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,&local_98);
  std::__cxx11::string::~string((string *)&local_e8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
             (const_iterator)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )nonce_postdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )nonce_postdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  pBVar4 = BIO_f_base64();
  pBVar5 = BIO_new(pBVar4);
  BIO_set_flags(pBVar5,0x100);
  pBVar6 = BIO_new_mem_buf((this->secret_)._M_dataplus._M_p,(int)(this->secret_)._M_string_length);
  pBVar5 = BIO_push(pBVar5,pBVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8,
             (this->secret_)._M_string_length,(allocator_type *)&len);
  iVar3 = BIO_read(pBVar5,local_e8._M_dataplus._M_p,
                   (int)local_e8._M_string_length - (int)local_e8._M_dataplus._M_p);
  BIO_free_all(pBVar5);
  if (-1 < iVar3) {
    _len = (long *)CONCAT44(uStack_ec,0x40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,0x40,&local_f1);
    ctx = (HMAC_CTX *)HMAC_CTX_new();
    md = EVP_sha512();
    HMAC_Init_ex(ctx,local_e8._M_dataplus._M_p,
                 (int)local_e8._M_string_length - (int)local_e8._M_dataplus._M_p,md,(ENGINE *)0x0);
    HMAC_Update(ctx,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start);
    HMAC_Final(ctx,(uchar *)local_98.h._0_8_,&len);
    HMAC_CTX_free(ctx);
    pBVar4 = BIO_f_base64();
    pBVar5 = BIO_new(pBVar4);
    BIO_set_flags(pBVar5,0x100);
    pBVar4 = BIO_s_mem();
    pBVar6 = BIO_new(pBVar4);
    pBVar5 = BIO_push(pBVar5,pBVar6);
    BIO_write(pBVar5,(void *)local_98.h._0_8_,local_98.h[2] - local_98.h[0]);
    BIO_ctrl(pBVar5,0xb,0,(void *)0x0);
    _len = (long *)0x0;
    BIO_ctrl(pBVar5,0x73,0,&len);
    lVar1 = _len[1];
    lVar2 = *_len;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,lVar1,lVar2 + lVar1);
    BIO_free_all(pBVar5);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&nonce_postdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed while decoding base64.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::signature(const std::string& path, 
			    const std::string& nonce, 
			    const std::string& postdata) const
{
   // add path to data to encrypt
   std::vector<unsigned char> data(path.begin(), path.end());

   // concatenate nonce and postdata and compute SHA256
   std::vector<unsigned char> nonce_postdata = sha256(nonce + postdata);

   // concatenate path and nonce_postdata (path + sha256(nonce + postdata))
   data.insert(data.end(), nonce_postdata.begin(), nonce_postdata.end());

   // and compute HMAC
   return b64_encode( hmac_sha512(data, b64_decode(secret_)) );
}